

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::ConstantManager::GetUIntConstId(ConstantManager *this,uint32_t val)

{
  uint32_t uVar1;
  TypeManager *this_00;
  Type *type;
  Constant *c;
  Instruction *this_01;
  uint32_t local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  this_00 = IRContext::get_type_mgr(this->ctx_);
  type = TypeManager::GetUIntType(this_00);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  local_3c = val;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,&local_3c);
  c = GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  this_01 = GetDefiningInstruction(this,c,0,(inst_iterator *)0x0);
  uVar1 = Instruction::result_id(this_01);
  return uVar1;
}

Assistant:

uint32_t ConstantManager::GetUIntConstId(uint32_t val) {
  Type* uint_type = context()->get_type_mgr()->GetUIntType();
  const Constant* c = GetConstant(uint_type, {val});
  return GetDefiningInstruction(c)->result_id();
}